

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_gainer_init_preallocated(ma_gainer_config *pConfig,void *pHeap,ma_gainer *pGainer)

{
  undefined8 *in_RDX;
  void *in_RSI;
  uint *in_RDI;
  ma_uint32 iChannel;
  ma_gainer_heap_layout heapLayout;
  ma_result result;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar1;
  size_t local_60;
  long local_58;
  long local_50;
  ma_result local_24;
  
  if (in_RDX == (undefined8 *)0x0) {
    local_24 = MA_INVALID_ARGS;
  }
  else {
    if (in_RDX != (undefined8 *)0x0) {
      memset(in_RDX,0,0x30);
    }
    if ((in_RDI == (uint *)0x0) || (in_RSI == (void *)0x0)) {
      local_24 = MA_INVALID_ARGS;
    }
    else {
      local_24 = ma_gainer_get_heap_layout
                           ((ma_gainer_config *)
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            (ma_gainer_heap_layout *)0x21dada);
      if (local_24 == MA_SUCCESS) {
        in_RDX[4] = in_RSI;
        if ((in_RSI != (void *)0x0) && (local_60 != 0)) {
          memset(in_RSI,0,local_60);
        }
        in_RDX[2] = (long)in_RSI + local_58;
        in_RDX[3] = (long)in_RSI + local_50;
        *(undefined4 *)((long)in_RDX + 0xc) = 0x3f800000;
        *in_RDX = *(undefined8 *)in_RDI;
        *(undefined4 *)(in_RDX + 1) = 0xffffffff;
        for (uVar1 = 0; uVar1 < *in_RDI; uVar1 = uVar1 + 1) {
          *(undefined4 *)(in_RDX[2] + (ulong)uVar1 * 4) = 0x3f800000;
          *(undefined4 *)(in_RDX[3] + (ulong)uVar1 * 4) = 0x3f800000;
        }
        local_24 = MA_SUCCESS;
      }
    }
  }
  return local_24;
}

Assistant:

MA_API ma_result ma_gainer_init_preallocated(const ma_gainer_config* pConfig, void* pHeap, ma_gainer* pGainer)
{
    ma_result result;
    ma_gainer_heap_layout heapLayout;
    ma_uint32 iChannel;

    if (pGainer == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pGainer);

    if (pConfig == NULL || pHeap == NULL) {
        return MA_INVALID_ARGS;
    }

    result = ma_gainer_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pGainer->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pGainer->pOldGains = (float*)ma_offset_ptr(pHeap, heapLayout.oldGainsOffset);
    pGainer->pNewGains = (float*)ma_offset_ptr(pHeap, heapLayout.newGainsOffset);
    pGainer->masterVolume = 1;

    pGainer->config = *pConfig;
    pGainer->t      = (ma_uint32)-1;  /* No interpolation by default. */

    for (iChannel = 0; iChannel < pConfig->channels; iChannel += 1) {
        pGainer->pOldGains[iChannel] = 1;
        pGainer->pNewGains[iChannel] = 1;
    }

    return MA_SUCCESS;
}